

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall yactfr::internal::JsonErtFragValReq::JsonErtFragValReq(JsonErtFragValReq *this)

{
  JsonAnyFullDtValReq *anyFullDtValReq;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar1;
  bool isRequired;
  bool isRequired_00;
  long lVar2;
  undefined1 allowNull;
  undefined8 in_stack_fffffffffffffd78;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  allocator local_27b;
  allocator local_27a;
  allocator local_279;
  allocator local_278 [8];
  type in_stack_fffffffffffffd90;
  string local_268;
  string local_248;
  string local_228;
  JsonObjValPropReq local_208;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f0;
  undefined1 local_1b8 [56];
  PropReqsEntry local_180;
  PropReqsEntry local_148 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_d8;
  PropReqsEntry local_a0;
  PropReqsEntry local_68;
  
  allowNull = (undefined1)((ulong)in_stack_fffffffffffffd78 >> 0x30);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_002fcc38;
  std::__cxx11::string::string((string *)&local_228,"event-record-class",&local_279);
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)0x0,isRequired);
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_148,(_anonymous_namespace_ *)0x0,isRequired_00);
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  JsonValReq::shared((optional<yactfr::internal::JsonValKind>)in_stack_fffffffffffffd90,
                     (bool)allowNull);
  JsonObjValPropReq::JsonObjValPropReq(&local_208,(Sp *)local_278,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>(&local_d8,&strs::dscId,&local_208);
  std::__cxx11::string::string((string *)&local_248,"specific-context-field-class",&local_27a);
  anyFullDtValReq = &this->_anyFullDtValReq;
  anon_unknown_0::anyDtPropReqEntry(&local_a0,&local_248,anyFullDtValReq,false);
  std::__cxx11::string::string((string *)&local_268,"payload-field-class",&local_27b);
  anon_unknown_0::anyDtPropReqEntry(&local_68,&local_268,anyFullDtValReq,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_1f0,local_1b8,&stack0xffffffffffffffd0,0,&local_27c,&local_27d,&local_27e);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_228,(PropReqs *)&local_1f0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1f0);
  lVar2 = 0;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_68.second._valReq.
                       super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + lVar2);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pcVar1 = *(char **)((long)&local_68.first._M_dataplus._M_p + lVar2);
    if (local_68.first.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1,*(long *)((long)&local_68.first.field_2 + lVar2) + 1);
    }
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != -0x188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_208._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (in_stack_fffffffffffffd90 != (type)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffd90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_002fcc38;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(anyFullDtValReq);
  return;
}

Assistant:

explicit JsonErtFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::dscId, {JsonValReq::shared(JsonVal::Kind::UInt)}},
            anyDtPropReqEntry(strs::specCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::payloadFc, _anyFullDtValReq), //-V1050
        }}
    {
    }